

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int tcptran_listener_setopt(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_stream_listener_set(*(nng_stream_listener **)((long)arg + 0x418),name,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_setopt(tcptran_ep_opts,name,arg,buf,sz,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
tcptran_listener_setopt(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	tcptran_ep *ep = arg;
	int         rv;

	rv = nni_stream_listener_set(ep->listener, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(tcptran_ep_opts, name, ep, buf, sz, t);
	}
	return (rv);
}